

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O1

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Mat *pMVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int *piVar6;
  pointer pMVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 in_EAX;
  int iVar11;
  undefined8 uVar12;
  uint uVar13;
  uint uVar15;
  undefined1 auVar14 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  allocator_type local_a9;
  Mat local_a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_60;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_48;
  
  uVar12._0_4_ = this->output_width;
  uVar12._4_4_ = this->output_height;
  auVar14._0_4_ = -(uint)((undefined4)uVar12 == 0);
  auVar14._4_4_ = -(uint)((undefined4)uVar12 == 0);
  auVar14._8_4_ = -(uint)(uVar12._4_4_ == 0);
  auVar14._12_4_ = -(uint)(uVar12._4_4_ == 0);
  iVar11 = movmskpd(in_EAX,auVar14);
  if (iVar11 != 0) {
    uVar15 = (uint)(bottom_blob->dims == 1);
    uVar2 = bottom_blob->w;
    uVar4 = bottom_blob->h;
    uVar13 = (int)(uVar15 << 0x1f) >> 0x1f;
    uVar15 = (int)(uVar15 << 0x1f) >> 0x1f;
    uVar3 = this->width_scale;
    uVar5 = this->height_scale;
    uVar12 = CONCAT44((int)((float)uVar5 *
                           (float)(uVar15 & 0x3f800000 | ~uVar15 & (uint)(float)(int)uVar4)),
                      (int)((float)uVar3 *
                           (float)(uVar13 & 0x3f800000 | ~uVar13 & (uint)(float)(int)uVar2)));
  }
  local_a8.cstep = 0;
  local_a8.data = (void *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.elemsize = 0;
  local_a8.elempack = 0;
  local_a8.allocator = (Allocator *)0x0;
  local_a8.dims = 0;
  local_a8.d = 0;
  local_a8.c = 0;
  local_a8.w = (int)uVar12;
  local_a8.h = (int)((ulong)uVar12 >> 0x20);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&local_48,2,(allocator_type *)&local_60);
  pMVar7 = local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != bottom_blob) {
    piVar6 = bottom_blob->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if ((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          if ((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->data != (void *)0x0) {
            free((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start)->data);
          }
        }
        else {
          (*(local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar7->cstep = 0;
    pMVar7->data = (void *)0x0;
    pMVar7->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&pMVar7->refcount + 4) = (undefined1  [16])0x0;
    pMVar7->dims = 0;
    pMVar7->w = 0;
    pMVar7->h = 0;
    pMVar7->d = 0;
    pMVar7->c = 0;
    piVar6 = bottom_blob->refcount;
    pMVar7->data = bottom_blob->data;
    pMVar7->refcount = piVar6;
    pMVar7->elemsize = bottom_blob->elemsize;
    pMVar7->elempack = bottom_blob->elempack;
    pMVar7->allocator = bottom_blob->allocator;
    iVar11 = bottom_blob->w;
    iVar8 = bottom_blob->h;
    iVar9 = bottom_blob->d;
    pMVar7->dims = bottom_blob->dims;
    pMVar7->w = iVar11;
    pMVar7->h = iVar8;
    pMVar7->d = iVar9;
    pMVar7->c = bottom_blob->c;
    pMVar7->cstep = bottom_blob->cstep;
  }
  pMVar1 = local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
  if (pMVar1 != &local_a8) {
    piVar6 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
          if (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start[1].data != (void *)0x0) {
            free(local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].data);
          }
        }
        else {
          (*(local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].cstep = 0;
    *(undefined1 (*) [16])
     ((long)&local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].refcount + 4) = (undefined1  [16])0x0;
    pMVar1->data = (void *)0x0;
    pMVar1->refcount = (int *)0x0;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].dims = 0;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].w = 0;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].h = 0;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].d = 0;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].c = 0;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].data = local_a8.data;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].refcount =
         (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].elemsize = local_a8.elemsize;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].elempack = local_a8.elempack;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].allocator = local_a8.allocator;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].dims = local_a8.dims;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].w = local_a8.w;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].h = local_a8.h;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].d = local_a8.d;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].c = local_a8.c;
    local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].cstep = local_a8.cstep;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&local_60,1,&local_a9);
  iVar11 = (*(this->super_Layer)._vptr_Layer[6])(this,&local_48,&local_60,opt);
  if (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != top_blob) {
    piVar6 = (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = top_blob->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar6 = (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    top_blob->data =
         (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->data;
    top_blob->refcount = piVar6;
    top_blob->elemsize =
         (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->elemsize;
    top_blob->elempack =
         (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->elempack;
    top_blob->allocator =
         (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->allocator;
    iVar8 = (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->w;
    iVar9 = (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->h;
    iVar10 = (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->d;
    top_blob->dims =
         (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->dims;
    top_blob->w = iVar8;
    top_blob->h = iVar9;
    top_blob->d = iVar10;
    top_blob->c = (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start)->c;
    top_blob->cstep =
         (local_60.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->cstep;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_60);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_48);
  piVar6 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar11;
}

Assistant:

int Interp::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    int outw = output_width;
    int outh = output_height;
    if (bottom_blob.dims == 1)
    {
        w = 1;
        h = 1;
    }
    if (outw == 0 || outh == 0)
    {
        outw = static_cast<int>(w * width_scale);
        outh = static_cast<int>(h * height_scale);
    }

    Mat reference_blob;
    reference_blob.w = outw;
    reference_blob.h = outh;

    std::vector<Mat> bottom_blobs(2);
    bottom_blobs[0] = bottom_blob;
    bottom_blobs[1] = reference_blob;

    std::vector<Mat> top_blobs(1);

    int ret = forward(bottom_blobs, top_blobs, opt);

    top_blob = top_blobs[0];

    return ret;
}